

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::majorUpdateFtranParallel(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  HVector_ptr pHVar3;
  HVector_ptr pHVar4;
  char *pcVar5;
  HighsSplitDeque *pHVar6;
  uint uVar7;
  HEkk *pHVar8;
  uint32_t uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint end;
  ulong uVar13;
  HVector_ptr *ppHVar14;
  TaskGroup tg;
  anon_class_24_4_3f80b2e7_for_functor local_178;
  undefined1 local_160 [24];
  HVector_ptr multi_vector [17];
  double multi_density [17];
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x45,0);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this->analysis,7,(this->col_BFRT).count,(this->ekk_instance_->info_).col_aq_density);
  }
  pHVar8 = this->ekk_instance_;
  multi_density[0] = (pHVar8->info_).col_aq_density;
  multi_vector[0] = &this->col_BFRT;
  if (this->edge_weight_mode == kSteepestEdge) {
    ppHVar14 = &this->multi_finish[0].row_ep;
    for (uVar13 = 1; (long)(uVar13 - 1) < (long)this->multi_nFinish; uVar13 = uVar13 + 1) {
      if (this->analysis->analyse_simplex_summary_data == true) {
        HighsSimplexAnalysis::operationRecordBefore
                  (this->analysis,8,(*ppHVar14)->count,(pHVar8->info_).row_DSE_density);
        pHVar8 = this->ekk_instance_;
      }
      multi_density[uVar13] = (pHVar8->info_).row_DSE_density;
      multi_vector[uVar13] = *ppHVar14;
      ppHVar14 = ppHVar14 + 0xf;
    }
  }
  else {
    uVar13 = 1;
  }
  ppHVar14 = &this->multi_finish[0].col_aq;
  for (lVar11 = 0; lVar11 < this->multi_nFinish; lVar11 = lVar11 + 1) {
    if (this->analysis->analyse_simplex_summary_data == true) {
      HighsSimplexAnalysis::operationRecordBefore
                (this->analysis,6,(*ppHVar14)->count,(pHVar8->info_).col_aq_density);
      pHVar8 = this->ekk_instance_;
    }
    multi_density[uVar13] = (pHVar8->info_).col_aq_density;
    multi_vector[uVar13] = *ppHVar14;
    uVar13 = uVar13 + 1;
    ppHVar14 = ppHVar14 + 0xf;
  }
  local_160._0_8_ = multi_vector;
  local_160._8_8_ = multi_density;
  local_160._16_8_ = this;
  if (uVar13 < 2) {
    majorUpdateFtranParallel::anon_class_24_3_04dd5b7a::operator()
              ((anon_class_24_3_04dd5b7a *)local_160,0,(HighsInt)uVar13);
  }
  else {
    tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
    tg.dequeHead = ((tg.workerDeque)->ownerData).head;
    do {
      pHVar6 = tg.workerDeque;
      uVar12 = (uint)uVar13;
      end = uVar12 >> 1;
      uVar13 = (ulong)end;
      local_178.grainSize = 1;
      uVar7 = ((tg.workerDeque)->ownerData).head;
      uVar10 = (ulong)uVar7;
      local_178.split = end;
      local_178.end = uVar12;
      local_178.f = (anon_class_32_4_8f8caa33 *)local_160;
      if (uVar10 < 0x2000) {
        uVar9 = (uint32_t)(uVar10 + 1);
        ((tg.workerDeque)->ownerData).head = uVar9;
        ((tg.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData =
             &PTR_operator___004335d8;
        *(anon_class_32_4_8f8caa33 **)
         (((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) =
             (anon_class_32_4_8f8caa33 *)local_160;
        pcVar5 = ((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData;
        *(ulong *)(pcVar5 + 8) = CONCAT44(uVar12,end);
        *(ulong *)(pcVar5 + 0x10) = CONCAT44(local_178._12_4_,1);
        if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
          ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar10 << 0x20 | uVar10 + 1;
          ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((tg.workerDeque)->ownerData).splitCopy = uVar9;
          ((tg.workerDeque)->ownerData).allStolenCopy = false;
          if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar2 = ((tg.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
          (peVar2->haveJobs).super___atomic_base<int>._M_i =
               (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((tg.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,tg.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(tg.workerDeque);
        }
      }
      else {
        if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(tg.workerDeque);
          uVar7 = (pHVar6->ownerData).head;
        }
        (pHVar6->ownerData).head = uVar7 + 1;
        HighsTask::
        Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
        ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_178);
      }
    } while (3 < uVar12);
    majorUpdateFtranParallel::anon_class_24_3_04dd5b7a::operator()
              ((anon_class_24_3_04dd5b7a *)local_160,0,end);
    ::highs::parallel::TaskGroup::taskWait(&tg);
    ::highs::parallel::TaskGroup::~TaskGroup(&tg);
  }
  pHVar8 = this->ekk_instance_;
  uVar10 = 0;
  uVar13 = (ulong)(uint)this->multi_nFinish;
  if (this->multi_nFinish < 1) {
    uVar13 = uVar10;
  }
  for (; uVar13 * 0x78 - uVar10 != 0; uVar10 = uVar10 + 0x78) {
    pHVar8->total_synthetic_tick_ =
         *(double *)(*(long *)((long)&this->multi_finish[0].col_aq + uVar10) + 0x38) +
         pHVar8->total_synthetic_tick_ +
         *(double *)(*(long *)((long)&this->multi_finish[0].row_ep + uVar10) + 0x38);
  }
  if (this->analysis->analyse_simplex_summary_data != false) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,7,(this->col_BFRT).count);
  }
  ppHVar14 = &this->multi_finish[0].col_aq;
  for (lVar11 = 0; lVar11 < this->multi_nFinish; lVar11 = lVar11 + 1) {
    pHVar3 = *ppHVar14;
    pHVar4 = ppHVar14[-1];
    HEkk::updateOperationResultDensity
              (this->ekk_instance_,(double)pHVar3->count / (double)this->solver_num_row,
               &(this->ekk_instance_->info_).col_aq_density);
    if (this->analysis->analyse_simplex_summary_data == true) {
      HighsSimplexAnalysis::operationRecordAfter(this->analysis,6,pHVar3->count);
    }
    if (this->edge_weight_mode == kSteepestEdge) {
      HEkk::updateOperationResultDensity
                (this->ekk_instance_,(double)pHVar4->count / (double)this->solver_num_row,
                 &(this->ekk_instance_->info_).row_DSE_density);
      if (this->analysis->analyse_simplex_summary_data == true) {
        HighsSimplexAnalysis::operationRecordAfter(this->analysis,8,pHVar4->count);
      }
    }
    ppHVar14 = ppHVar14 + 0xf;
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x45,0);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranParallel() {
  analysis->simplexTimerStart(FtranMixParClock);

  // Prepare buffers
  HighsInt multi_ntasks = 0;
  double multi_density[kSimplexConcurrencyLimit * 2 + 1];
  HVector_ptr multi_vector[kSimplexConcurrencyLimit * 2 + 1];
  // BFRT first
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtranBfrt, col_BFRT.count,
                                    ekk_instance_.info_.col_aq_density);
  multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
  multi_vector[multi_ntasks] = &col_BFRT;
  multi_ntasks++;
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    // Then DSE
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordBefore(kSimplexNlaFtranDse,
                                        multi_finish[iFn].row_ep->count,
                                        ekk_instance_.info_.row_DSE_density);
      multi_density[multi_ntasks] = ekk_instance_.info_.row_DSE_density;
      multi_vector[multi_ntasks] = multi_finish[iFn].row_ep;
      multi_ntasks++;
    }
  }
  // Then Column
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordBefore(kSimplexNlaFtran,
                                      multi_finish[iFn].col_aq->count,
                                      ekk_instance_.info_.col_aq_density);
    multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
    multi_vector[multi_ntasks] = multi_finish[iFn].col_aq;
    multi_ntasks++;
  }

  // Perform FTRAN
  // #pragma omp parallel for schedule(dynamic, 1)
  // printf("majorUpdateFtranParallel: starting %d tasks\n", multi_ntasks);
  highs::parallel::for_each(0, multi_ntasks, [&](HighsInt start, HighsInt end) {
    for (HighsInt i = start; i < end; i++) {
      HVector_ptr rhs = multi_vector[i];
      double density = multi_density[i];
      HighsTimerClock* factor_timer_clock_pointer =
          analysis->getThreadFactorTimerClockPointer();
      ekk_instance_.simplex_nla_.ftran(*rhs, density,
                                       factor_timer_clock_pointer);
    }
  });

  // Update ticks
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    ekk_instance_.total_synthetic_tick_ += Col->synthetic_tick;
    ekk_instance_.total_synthetic_tick_ += Row->synthetic_tick;
  }

  // Update rates
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtranBfrt, col_BFRT.count);
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    const double local_col_aq_density = (double)Col->count / solver_num_row;
    ekk_instance_.updateOperationResultDensity(
        local_col_aq_density, ekk_instance_.info_.col_aq_density);
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordAfter(kSimplexNlaFtran, Col->count);
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      const double local_row_DSE_density = (double)Row->count / solver_num_row;
      ekk_instance_.updateOperationResultDensity(
          local_row_DSE_density, ekk_instance_.info_.row_DSE_density);
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordAfter(kSimplexNlaFtranDse, Row->count);
    }
  }
  analysis->simplexTimerStop(FtranMixParClock);
}